

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Reader::FlushProfiler(BP5Reader *this)

{
  __pid_t _Var1;
  uint i;
  ulong uVar2;
  long lVar3;
  anon_class_16_2_75bba2ca lf_AddMe;
  vector<char,_std::allocator<char>_> profilingJSON;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string bpBaseName;
  string profileFileName;
  string LineJSON;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  stringstream PIDstr;
  long local_4b0 [3];
  uint auStack_498 [88];
  FileFStream profilingJSONStream;
  
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_
            (&transportTypes,&this->m_DataFileManager);
  transportman::TransportMan::GetTransportsProfilers(&transportProfilers,&this->m_DataFileManager);
  lf_AddMe.transportTypes = &transportTypes;
  lf_AddMe.transportProfilers = &transportProfilers;
  FlushProfiler::anon_class_16_2_75bba2ca::operator()(&lf_AddMe,&this->m_MDFileManager);
  FlushProfiler::anon_class_16_2_75bba2ca::operator()(&lf_AddMe,&this->m_MDIndexFileManager);
  FlushProfiler::anon_class_16_2_75bba2ca::operator()(&lf_AddMe,&this->m_FileMetaMetadataManager);
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < this->m_Threads; uVar2 = uVar2 + 1) {
    FlushProfiler::anon_class_16_2_75bba2ca::operator()
              (&lf_AddMe,
               (TransportMan *)
               ((long)&((this->fileManagers).
                        super__Vector_base<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_vptr_TransportMan + lVar3));
    lVar3 = lVar3 + 0x50;
  }
  profiling::JSONProfiler::GetRankProfilingJSON
            ((string *)&profilingJSONStream,&this->m_JSONProfiler,&transportTypes,
             &transportProfilers);
  std::operator+(&LineJSON,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &profilingJSONStream,",\n");
  std::__cxx11::string::~string((string *)&profilingJSONStream);
  profiling::JSONProfiler::AggregateProfilingJSON(&profilingJSON,&this->m_JSONProfiler,&LineJSON);
  if ((this->super_BP5Engine).m_RankMPI == 0) {
    profileFileName._M_dataplus._M_p = (pointer)&profileFileName.field_2;
    profileFileName._M_string_length = 0;
    profileFileName.field_2._M_local_buf[0] = '\0';
    transport::FileFStream::FileFStream(&profilingJSONStream,&(this->super_Engine).m_Comm);
    adios2sys::SystemTools::GetFilenameName(&bpBaseName,&(this->super_Engine).m_Name);
    _Var1 = getpid();
    std::__cxx11::stringstream::stringstream((stringstream *)&PIDstr);
    *(uint *)((long)auStack_498 + *(long *)(local_4b0[0] + -0x18)) =
         *(uint *)((long)auStack_498 + *(long *)(local_4b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<(local_4b0,_Var1);
    std::operator+(&local_5a0,"/tmp/",&bpBaseName);
    std::operator+(&local_580,&local_5a0,"_");
    std::__cxx11::stringbuf::str();
    std::operator+(&local_560,&local_580,&local_5c0);
    std::operator+(&local_4e0,&local_560,"_profiling.json");
    std::__cxx11::string::operator=((string *)&profileFileName,(string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    remove(profileFileName._M_dataplus._M_p);
    transport::FileFStream::Open(&profilingJSONStream,&profileFileName,Write,false,false);
    transport::FileFStream::Write
              (&profilingJSONStream,
               profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,0xffffffffffffffff);
    transport::FileFStream::Close(&profilingJSONStream);
    std::__cxx11::stringstream::~stringstream((stringstream *)&PIDstr);
    std::__cxx11::string::~string((string *)&bpBaseName);
    transport::FileFStream::~FileFStream(&profilingJSONStream);
    std::__cxx11::string::~string((string *)&profileFileName);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&profilingJSON.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&LineJSON);
  std::_Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~_Vector_base(&transportProfilers.
                 super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transportTypes);
  return;
}

Assistant:

void BP5Reader::FlushProfiler()
{
    auto transportTypes = m_DataFileManager.GetTransportsTypes();
    auto transportProfilers = m_DataFileManager.GetTransportsProfilers();

    auto lf_AddMe = [&](transportman::TransportMan &tm) -> void {
        auto tmpT = tm.GetTransportsTypes();
        auto tmpP = tm.GetTransportsProfilers();

        if (tmpT.size() > 0)
        {
            transportTypes.insert(transportTypes.end(), tmpT.begin(), tmpT.end());
            transportProfilers.insert(transportProfilers.end(), tmpP.begin(), tmpP.end());
        }
    };

    lf_AddMe(m_MDFileManager);
    lf_AddMe(m_MDIndexFileManager);
    lf_AddMe(m_FileMetaMetadataManager);

    for (unsigned int i = 0; i < m_Threads; ++i)
    {
        lf_AddMe(fileManagers[i]);
    }

    const std::string LineJSON(
        m_JSONProfiler.GetRankProfilingJSON(transportTypes, transportProfilers) + ",\n");

    const std::vector<char> profilingJSON(m_JSONProfiler.AggregateProfilingJSON(LineJSON));

    if (m_RankMPI == 0)
    {
        std::string profileFileName;
        transport::FileFStream profilingJSONStream(m_Comm);
        std::string bpBaseName = adios2sys::SystemTools::GetFilenameName(m_Name);

        auto PID = getpid();
        std::stringstream PIDstr;
        PIDstr << std::hex << PID;
        // write profile json in /tmp
        profileFileName = "/tmp/" + bpBaseName + "_" + PIDstr.str() + "_profiling.json";

        try
        {
            (void)remove(profileFileName.c_str());
            profilingJSONStream.Open(profileFileName, Mode::Write);
            profilingJSONStream.Write(profilingJSON.data(), profilingJSON.size());
            profilingJSONStream.Close();
        }
        catch (...)
        { // do nothing
        }
    }
}